

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O3

void __thiscall FIX::Initiator::setConnected(Initiator *this,SessionID *sessionID)

{
  int iVar1;
  pair<std::_Rb_tree_iterator<FIX::SessionID>,_std::_Rb_tree_iterator<FIX::SessionID>_> pVar2;
  
  Mutex::lock(&this->m_mutex);
  pVar2 = std::
          _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
          ::equal_range(&(this->m_pending)._M_t,sessionID);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_M_erase_aux(&(this->m_pending)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  std::
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  ::_M_insert_unique<FIX::SessionID_const&>
            ((_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
              *)&this->m_connected,sessionID);
  pVar2 = std::
          _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
          ::equal_range(&(this->m_disconnected)._M_t,sessionID);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_M_erase_aux(&(this->m_disconnected)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void Initiator::setConnected(const SessionID &sessionID) {
  Locker l(m_mutex);

  m_pending.erase(sessionID);
  m_connected.insert(sessionID);
  m_disconnected.erase(sessionID);
}